

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O1

void __thiscall fs_tests::rename::test_method(rename *this)

{
  long lVar1;
  path src;
  path dest;
  _func_int **pp_Var2;
  undefined8 uVar3;
  readonly_property<bool> rVar4;
  char cVar5;
  int iVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffb28;
  _func_int **in_stack_fffffffffffffb30;
  bool in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb39;
  undefined8 in_stack_fffffffffffffb40;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffb70;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  string *local_430;
  undefined **local_428;
  char *local_420;
  undefined1 *local_418;
  string **local_410;
  string *local_408;
  undefined **local_400;
  element_type *local_3f8;
  shared_count sStack_3f0;
  string **local_3e8;
  char *local_3e0;
  char *local_3d8;
  assertion_result local_3d0;
  string contents;
  ofstream file;
  filebuf local_390 [8];
  undefined1 *local_388;
  undefined ***local_380;
  ios_base local_2a0 [272];
  path local_190;
  path local_168;
  string path2_contents;
  string path1_contents;
  path local_100;
  path path2;
  path local_b0;
  path path1;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false)
  ;
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_b0,1,"a");
  std::filesystem::__cxx11::path::path(&path1.super_path,&local_b0);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::path(&local_100,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_100,1,"b");
  std::filesystem::__cxx11::path::path(&path2.super_path,&local_100);
  std::filesystem::__cxx11::path::~path(&local_100);
  path1_contents._M_dataplus._M_p = (pointer)&path1_contents.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&path1_contents,"1111","");
  path2_contents._M_dataplus._M_p = (pointer)&path2_contents.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&path2_contents,"2222","");
  std::ofstream::ofstream(&file,path1.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&file,path1_contents._M_dataplus._M_p,path1_contents._M_string_length);
  uVar3 = _vtable;
  pp_Var2 = _VTT;
  _file = _VTT;
  *(undefined8 *)(&file + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf(local_390);
  std::ios_base::~ios_base(local_2a0);
  std::ofstream::ofstream(&file,path2.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&file,path2_contents._M_dataplus._M_p,path2_contents._M_string_length);
  _file = pp_Var2;
  *(undefined8 *)(&file + (long)pp_Var2[-3]) = uVar3;
  std::filebuf::~filebuf(local_390);
  std::ios_base::~ios_base(local_2a0);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x81;
  file_00.m_begin = (iterator)&local_440;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_450,msg);
  std::filesystem::__cxx11::path::path(&local_168,&path1.super_path);
  std::filesystem::__cxx11::path::path(&local_190,&path2.super_path);
  _cVar9 = 0x3d7e1f;
  src.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffb30;
  src.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb28;
  src.super_path._M_pathname.field_2._M_local_buf[0] = in_stack_fffffffffffffb38;
  src.super_path._M_pathname.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffffb39;
  src.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffb40;
  src.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffb48._M_head_impl;
  dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffb58;
  dest.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb50;
  dest.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffb60;
  dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffb68;
  dest.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffb70._M_head_impl;
  rVar4.super_class_property<bool>.value = (class_property<bool>)RenameOver(src,dest);
  local_3f8 = (element_type *)0x0;
  sStack_3f0.pi_ = (sp_counted_base *)0x0;
  local_380 = &local_428;
  local_428 = (undefined **)0xe96003;
  local_420 = "";
  local_390[0] = (filebuf)0x0;
  _file = &PTR__lazy_ostream_013abc70;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_458 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_400._0_1_ = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_400,(lazy_ostream *)&file,1,0,WARN,_cVar9,(size_t)&local_460
             ,0x81);
  boost::detail::shared_count::~shared_count(&sStack_3f0);
  std::filesystem::__cxx11::path::~path(&local_190);
  std::filesystem::__cxx11::path::~path(&local_168);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x83;
  file_01.m_begin = (iterator)&local_470;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_480,
             msg_00);
  _cVar9 = 0x3d7efa;
  cVar5 = std::filesystem::status(&path1.super_path);
  local_400 = (undefined **)CONCAT71(local_400._1_7_,cVar5 == -1 || cVar5 == '\0');
  local_3f8 = (element_type *)0x0;
  sStack_3f0.pi_ = (sp_counted_base *)0x0;
  local_428 = (undefined **)0xe9601c;
  local_420 = "";
  local_390[0] = (filebuf)0x0;
  _file = &PTR__lazy_ostream_013abc70;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_380 = &local_428;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_400,(lazy_ostream *)&file,1,0,WARN,_cVar9,
             (size_t)&stack0xfffffffffffffb70,0x83);
  boost::detail::shared_count::~shared_count(&sStack_3f0);
  std::ifstream::ifstream(&file,path2.super_path._M_pathname._M_dataplus._M_p,_S_in);
  contents._M_string_length = 0;
  contents.field_2._M_local_buf[0] = '\0';
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  std::operator>>((istream *)&file,(string *)&contents);
  file_02.m_end = (iterator)0x89;
  file_02.m_begin = &stack0xfffffffffffffb60;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
             (size_t)&stack0xfffffffffffffb50,msg_01);
  if (contents._M_string_length == path1_contents._M_string_length) {
    if (contents._M_string_length == 0) {
      local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar6 = bcmp(contents._M_dataplus._M_p,path1_contents._M_dataplus._M_p,
                   contents._M_string_length);
      local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar6 == 0);
    }
  }
  else {
    local_3d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_3d0.m_message.px = (element_type *)0x0;
  local_3d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_3d8 = "";
  local_3e8 = &local_408;
  local_3f8 = (element_type *)((ulong)local_3f8 & 0xffffffffffffff00);
  local_400 = &PTR__lazy_ostream_013abbf0;
  sStack_3f0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_410 = &local_430;
  local_430 = &path1_contents;
  local_420 = (char *)((ulong)local_420 & 0xffffffffffffff00);
  local_428 = &PTR__lazy_ostream_013abbf0;
  local_418 = boost::unit_test::lazy_ostream::inst;
  local_408 = &contents;
  boost::test_tools::tt_detail::report_assertion
            (&local_3d0,(lazy_ostream *)&stack0xfffffffffffffb30,1,2,REQUIRE,0xe62477,
             (size_t)&local_3e0,0x89,(assertion_result *)&local_400,"path1_contents",&local_428);
  boost::detail::shared_count::~shared_count(&local_3d0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)contents._M_dataplus._M_p != &contents.field_2) {
    operator_delete(contents._M_dataplus._M_p,
                    CONCAT71(contents.field_2._M_allocated_capacity._1_7_,
                             contents.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(&file);
  std::filesystem::remove(&path2.super_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path2_contents._M_dataplus._M_p != &path2_contents.field_2) {
    operator_delete(path2_contents._M_dataplus._M_p,path2_contents.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path1_contents._M_dataplus._M_p != &path1_contents.field_2) {
    operator_delete(path1_contents._M_dataplus._M_p,path1_contents.field_2._M_allocated_capacity + 1
                   );
  }
  std::filesystem::__cxx11::path::~path(&path2.super_path);
  std::filesystem::__cxx11::path::~path(&path1.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rename)
{
    const fs::path tmpfolder{m_args.GetDataDirBase()};

    const fs::path path1{tmpfolder / "a"};
    const fs::path path2{tmpfolder / "b"};

    const std::string path1_contents{"1111"};
    const std::string path2_contents{"2222"};

    {
        std::ofstream file{path1};
        file << path1_contents;
    }

    {
        std::ofstream file{path2};
        file << path2_contents;
    }

    // Rename path1 -> path2.
    BOOST_CHECK(RenameOver(path1, path2));

    BOOST_CHECK(!fs::exists(path1));

    {
        std::ifstream file{path2};
        std::string contents;
        file >> contents;
        BOOST_CHECK_EQUAL(contents, path1_contents);
    }
    fs::remove(path2);
}